

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase176::run(TestCase176 *this)

{
  long lVar1;
  PromiseArena *pPVar2;
  AsyncIoStream *pAVar3;
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation location_01;
  SourceLocation location_02;
  SourceLocation location_03;
  OwnPromiseNode OVar4;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> OVar5;
  anon_class_8_1_5036e509_for_func aVar6;
  int iVar7;
  undefined4 extraout_var;
  void *pvVar9;
  int *in_RCX;
  ulong uVar10;
  String *params_1;
  char *pcVar11;
  SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:219:13)>
  *location_04;
  SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:223:11)>
  *location_05;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:241:11)>
  *location_06;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:191:22)>
  *location_07;
  SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:193:11)>
  *location_08;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate_2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1c0;
  OwnPromiseNode intermediate_3;
  OwnPromiseNode intermediate;
  void *continuationTracePtr_4;
  String *pSStack_198;
  char *local_190;
  bool local_180;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_178;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_170;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_168;
  anon_class_8_1_5036e509_for_func local_160;
  void *continuationTracePtr_2;
  PromiseNode *local_150;
  void *continuationTracePtr;
  size_t local_140;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_130;
  char receiveBuffer [4];
  String result;
  Own<kj::AsyncIoStream,_std::nullptr_t> client;
  Own<kj::AsyncIoStream,_std::nullptr_t> server;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  PromiseFulfillerPair<void> ready;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>
  _kjDefer181;
  String path;
  AsyncIoContext ioContext;
  char *pcVar8;
  
  setupAsyncIo();
  iVar7 = (*(ioContext.provider.ptr)->_vptr_AsyncIoProvider[3])();
  pcVar8 = (char *)CONCAT44(extraout_var,iVar7);
  continuationTracePtr_4._0_4_ = getpid();
  str<char_const(&)[23],int>
            (&path,(kj *)"/tmp/kj-async-io-test.",(char (*) [23])&continuationTracePtr_4,in_RCX);
  _kjDefer181.maybeFunc.ptr.isSet = true;
  listener.disposer = (Disposer *)0x0;
  listener.ptr = (ConnectionReceiver *)0x0;
  receiveBuffer[0] = '\0';
  receiveBuffer[1] = '\0';
  receiveBuffer[2] = '\0';
  receiveBuffer[3] = '\0';
  server.disposer = (Disposer *)0x0;
  server.ptr = (AsyncIoStream *)0x0;
  client.disposer = (Disposer *)0x0;
  client.ptr = (AsyncIoStream *)0x0;
  location_03.fileName._4_4_ = continuationTracePtr_4._4_4_;
  location_03.fileName._0_4_ = (__pid_t)continuationTracePtr_4;
  location_03.function = (char *)pSStack_198;
  location_03._16_8_ = local_190;
  _kjDefer181.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:181:3)>_2
        )&path;
  newPromiseAndFulfiller<void>(location_03);
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:191:22)>
       ::anon_class_16_2_cd6ceaae_for_func::operator();
  lVar1 = *(long *)((long)ready.promise.super_PromiseBase.node.ptr + 8);
  result.content.ptr = pcVar8;
  result.content.size_ = (size_t)&path;
  if (lVar1 == 0 || (ulong)((long)ready.promise.super_PromiseBase.node.ptr - lVar1) < 0x30) {
    pvVar9 = operator_new(0x400);
    location_07 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:191:22)>
                   *)((long)pvVar9 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase176::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__1,void*&>
              (location_07,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ready,
               (anon_class_16_2_cd6ceaae_for_func *)&result,&continuationTracePtr);
    *(void **)((long)pvVar9 + 0x3d8) = pvVar9;
  }
  else {
    *(undefined8 *)((long)ready.promise.super_PromiseBase.node.ptr + 8) = 0;
    location_07 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:191:22)>
                   *)((long)ready.promise.super_PromiseBase.node.ptr + -0x30);
    ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase176::run()::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__1,void*&>
              (location_07,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&ready,
               (anon_class_16_2_cd6ceaae_for_func *)&result,&continuationTracePtr);
    *(long *)((long)ready.promise.super_PromiseBase.node.ptr + -0x28) = lVar1;
  }
  continuationTracePtr_4._0_4_ = 0x3d3151;
  continuationTracePtr_4._4_4_ = 0;
  pSStack_198 = (String *)&DAT_003d31b0;
  local_190 = (char *)0x4c0000058b;
  location.function = &DAT_003d31b0;
  location.fileName = &DAT_003d3151;
  location.lineNumber = 0x58b;
  location.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_07;
  kj::_::maybeChain<kj::Own<kj::NetworkAddress,decltype(nullptr)>>
            (&intermediate_2,(Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&intermediate,
             location);
  OVar4 = intermediate_2;
  intermediate_2.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  local_1c0.ptr = OVar4.ptr;
  continuationTracePtr_2 = (void *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  OVar5.ptr = local_1c0.ptr;
  local_160.client = &client;
  continuationTracePtr =
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:193:11)>
       ::anon_class_8_1_5036e509_for_func::operator();
  pPVar2 = ((local_1c0.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_1c0.ptr - (long)pPVar2) < 0x28) {
    pvVar9 = operator_new(0x400);
    location_08 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:193:11)>
                   *)((long)pvVar9 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase176::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__2,void*&>
              (location_08,&local_1c0,&local_160,&continuationTracePtr);
    *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
  }
  else {
    ((local_1c0.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_08 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:193:11)>
                   *)&local_1c0.ptr[-3].super_PromiseArenaMember.arena;
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase176::run()::__2>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__2,void*&>
              (location_08,&local_1c0,&local_160,&continuationTracePtr);
    OVar5.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  continuationTracePtr_4._0_4_ = 0x3d3151;
  continuationTracePtr_4._4_4_ = 0;
  pSStack_198 = (String *)&DAT_003d31b0;
  local_190 = (char *)0x4c0000058b;
  location_00.function = &DAT_003d31b0;
  location_00.fileName = &DAT_003d3151;
  location_00.lineNumber = 0x58b;
  location_00.columnNumber = 0x4c;
  intermediate.ptr = (PromiseNode *)location_08;
  kj::_::maybeChain<void>(&intermediate_2,(Promise<void> *)&intermediate,location_00);
  OVar4 = intermediate_2;
  intermediate_2.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  intermediate_3 = OVar4;
  continuationTracePtr_2 = (void *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_2);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  OVar4 = intermediate_3;
  pPVar2 = ((intermediate_3.ptr)->super_PromiseArenaMember).arena;
  uVar10 = (long)intermediate_3.ptr - (long)pPVar2;
  params_1 = (String *)CONCAT71((int7)(uVar10 >> 8),0x27 < uVar10);
  if (pPVar2 != (PromiseArena *)0x0 && 0x27 < uVar10) {
    ((intermediate_3.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)&intermediate_3.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&intermediate_3,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:214:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    OVar4.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_00583fb0;
    OVar4.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  else {
    pvVar9 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&intermediate_3,
               kj::_::
               TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h:1653:25),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:214:13)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_destroy_00583fb0;
    *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
  }
  continuationTracePtr_4._0_4_ = 0;
  continuationTracePtr_4._4_4_ = 0;
  continuationTracePtr = (void *)0x0;
  intermediate.ptr = &this_00->super_PromiseNode;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&continuationTracePtr_4);
  kj::_::detach((Promise<void> *)&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
  str<char_const(&)[6],kj::String&>
            ((String *)&continuationTracePtr,(kj *)"unix:",(char (*) [6])&path,params_1);
  pcVar11 = (char *)continuationTracePtr;
  if (local_140 == 0) {
    pcVar11 = "";
  }
  (*(code *)**(undefined8 **)pcVar8)(&local_178,pcVar8,pcVar11,local_140 + (local_140 == 0),0);
  intermediate.ptr = (PromiseNode *)&listener;
  continuationTracePtr_2 =
       kj::_::
       SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:219:13)>
       ::anon_class_16_2_1cb5feba_for_func::operator();
  pPVar2 = ((local_178.ptr)->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_178.ptr - (long)pPVar2) < 0x30) {
    pvVar9 = operator_new(0x400);
    location_04 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:219:13)>
                   *)((long)pvVar9 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase176::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__4,void*&>
              (location_04,&local_178,(anon_class_16_2_1cb5feba_for_func *)&intermediate,
               &continuationTracePtr_2);
    *(void **)((long)pvVar9 + 0x3d8) = pvVar9;
  }
  else {
    ((local_178.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_04 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:219:13)>
                   *)(local_178.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::TestCase176::run()::__4>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__4,void*&>
              (location_04,&local_178,(anon_class_16_2_1cb5feba_for_func *)&intermediate,
               &continuationTracePtr_2);
    local_178.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_4._0_4_ = 0x3d3151;
  continuationTracePtr_4._4_4_ = 0;
  pSStack_198 = (String *)&DAT_003d31b0;
  local_190 = (char *)0x4c0000058b;
  location_01.function = &DAT_003d31b0;
  location_01.fileName = &DAT_003d3151;
  location_01.lineNumber = 0x58b;
  location_01.columnNumber = 0x4c;
  intermediate_2.ptr = (PromiseNode *)location_04;
  kj::_::maybeChain<kj::AuthenticatedStream>
            (&local_1c0,(Promise<kj::AuthenticatedStream> *)&intermediate_2,location_01);
  OVar5.ptr = local_1c0.ptr;
  local_1c0.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
  local_170.ptr = OVar5.ptr;
  intermediate_3.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  OVar5.ptr = local_170.ptr;
  continuationTracePtr_2 = &server;
  intermediate_2.ptr =
       (PromiseNode *)
       kj::_::
       SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:223:11)>
       ::anon_class_16_2_f6449cab_for_func::operator();
  pPVar2 = ((local_170.ptr)->super_PromiseArenaMember).arena;
  local_150 = (PromiseNode *)receiveBuffer;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_170.ptr - (long)pPVar2) < 0x30) {
    pvVar9 = operator_new(0x400);
    location_05 = (SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:223:11)>
                   *)((long)pvVar9 + 0x3d0);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AuthenticatedStream,kj::(anonymous_namespace)::TestCase176::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__5,void*&>
              (location_05,&local_170,(anon_class_16_2_f6449cab_for_func *)&continuationTracePtr_2,
               &intermediate_2.ptr);
    *(void **)((long)pvVar9 + 0x3d8) = pvVar9;
  }
  else {
    ((local_170.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_05 = (SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:223:11)>
                   *)(local_170.ptr + -3);
    ctor<kj::_::SimpleTransformPromiseNode<kj::AuthenticatedStream,kj::(anonymous_namespace)::TestCase176::run()::__5>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__5,void*&>
              (location_05,&local_170,(anon_class_16_2_f6449cab_for_func *)&continuationTracePtr_2,
               &intermediate_2.ptr);
    OVar5.ptr[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  continuationTracePtr_4._0_4_ = 0x3d3151;
  continuationTracePtr_4._4_4_ = 0;
  pSStack_198 = (String *)&DAT_003d31b0;
  local_190 = (char *)0x4c0000058b;
  location_02.function = &DAT_003d31b0;
  location_02.fileName = &DAT_003d3151;
  location_02.lineNumber = 0x58b;
  location_02.columnNumber = 0x4c;
  intermediate_3.ptr = (PromiseNode *)location_05;
  kj::_::maybeChain<unsigned_long>
            ((OwnPromiseNode *)&local_160,(Promise<unsigned_long> *)&intermediate_3,location_02);
  aVar6.client = local_160.client;
  local_160.client = (Own<kj::AsyncIoStream,_std::nullptr_t> *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_160);
  local_168.ptr = (PromiseNode *)aVar6.client;
  local_1c0.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1c0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  OVar5.ptr = local_168.ptr;
  continuationTracePtr_4._0_4_ = 0x1e63ae;
  continuationTracePtr_4._4_4_ = 0;
  pAVar3 = (AsyncIoStream *)((local_168.ptr)->super_PromiseArenaMember).arena;
  local_1c0.ptr = (PromiseNode *)receiveBuffer;
  if (pAVar3 == (AsyncIoStream *)0x0 || (ulong)((long)local_168.ptr - (long)pAVar3) < 0x28) {
    pvVar9 = operator_new(0x400);
    location_06 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:241:11)>
                   *)((long)pvVar9 + 0x3d8);
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase176::run()::__6>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__6,void*&>
              (location_06,&local_168,(anon_class_8_1_2dcb5b23_for_func *)&local_1c0,
               &continuationTracePtr_4);
    *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
  }
  else {
    ((local_168.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_06 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:241:11)>
                   *)&((Own<kj::AsyncIoStream,_std::nullptr_t> *)(local_168.ptr + -3))->ptr;
    ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::TestCase176::run()::__6>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::TestCase176::run()::__6,void*&>
              (location_06,&local_168,(anon_class_8_1_2dcb5b23_for_func *)&local_1c0,
               &continuationTracePtr_4);
    ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(OVar5.ptr + -2))->disposer = (Disposer *)pAVar3;
  }
  intermediate_2.ptr = (PromiseNode *)0x0;
  intermediate_3.ptr = (PromiseNode *)0x0;
  local_130.ptr = (PromiseNode *)location_06;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_3);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate_2);
  Promise<kj::String>::wait((Promise<kj::String> *)&result,&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_130);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_168);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_170);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_178);
  Array<char>::~Array((Array<char> *)&continuationTracePtr);
  continuationTracePtr = "foo";
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_4,
             (DebugExpression<char_const(&)[4]> *)&continuationTracePtr,&result);
  if ((local_180 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (result)\", _kjCondition, \"foo\", result",
               (char (*) [37])"failed: expected (\"foo\") == (result)",
               (DebugComparison<const_char_(&)[4],_kj::String_&> *)&continuationTracePtr_4,
               (char (*) [4])0x423c58,&result);
  }
  Array<char>::~Array(&result.content);
  PromiseFulfillerPair<void>::~PromiseFulfillerPair(&ready);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&client);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&server);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose(&listener);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:181:3)>
  ::~Deferred(&_kjDefer181);
  Array<char>::~Array(&path.content);
  AsyncIoContext::~AsyncIoContext(&ioContext);
  return;
}

Assistant:

TEST(AsyncIo, UnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();

  auto path = kj::str(TMPDIR "/kj-async-io-test.", getpid());
  KJ_DEFER(unlink(path.cStr()));

  Own<ConnectionReceiver> listener;
  Own<AsyncIoStream> server;
  Own<AsyncIoStream> client;

  char receiveBuffer[4]{};

  auto ready = newPromiseAndFulfiller<void>();

  ready.promise.then([&]() {
    return network.parseAddress(kj::str("unix:", path));
  }).then([&](Own<NetworkAddress>&& addr) {
    auto promise = addr->connectAuthenticated();
    return promise.then([&,addr=kj::mv(addr)](AuthenticatedStream result) mutable {
      auto id = result.peerIdentity.downcast<LocalPeerIdentity>();
      auto creds = id->getCredentials();
      KJ_IF_SOME(p, creds.pid) {
        KJ_EXPECT(p == getpid());
#if __linux__ || __APPLE__
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null PID");
#endif
      }
      KJ_IF_SOME(u, creds.uid) {
        KJ_EXPECT(u == getuid());
      } else {
        KJ_FAIL_EXPECT("LocalPeerIdentity for unix socket had null UID");
      }

      client = kj::mv(result.stream);
      return client->write("foo"_kjb);
    });
  }